

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::DockContextCalcDropPosForDocking
               (ImGuiWindow *target,ImGuiDockNode *target_node,ImGuiWindow *payload,
               ImGuiDir split_dir,bool split_outer,ImVec2 *out_pos)

{
  ImVec2 IVar1;
  undefined7 in_register_00000081;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiDockPreviewData local_138;
  
  bVar2 = false;
  if ((int)CONCAT71(in_register_00000081,split_outer) == 0) {
    local_138.FutureNode.Windows.Size = 0;
    local_138.FutureNode.Windows.Capacity = 0;
    local_138.FutureNode.Windows.Data = (ImGuiWindow **)0x0;
    local_138.FutureNode.WindowClass.ClassId = 0;
    local_138.FutureNode.WindowClass.ParentViewportId = 0;
    local_138.FutureNode.WindowClass.ViewportFlagsOverrideSet = 0;
    local_138.FutureNode.WindowClass.ViewportFlagsOverrideClear = 0;
    local_138.FutureNode.WindowClass.DockingAlwaysTabBar = false;
    local_138.FutureNode.WindowClass.DockingAllowUnclassed = true;
    local_138.FutureNode.Pos.x = 0.0;
    local_138.FutureNode.Pos.y = 0.0;
    local_138.FutureNode.Size.x = 0.0;
    local_138.FutureNode.Size.y = 0.0;
    local_138.FutureNode.SizeRef.x = 0.0;
    local_138.FutureNode.SizeRef.y = 0.0;
    local_138.FutureNode.ID = 0;
    local_138.FutureNode.SharedFlags = 0;
    local_138.FutureNode.LocalFlags = 0;
    local_138.FutureNode.TabBar = (ImGuiTabBar *)0x0;
    local_138.FutureNode.ParentNode = (ImGuiDockNode *)0x0;
    local_138.FutureNode.ChildNodes[0] = (ImGuiDockNode *)0x0;
    local_138.FutureNode.ChildNodes[1] = (ImGuiDockNode *)0x0;
    local_138.FutureNode.SplitAxis = -1;
    local_138.FutureNode.State = ImGuiDockNodeState_Unknown;
    local_138.FutureNode.HostWindow = (ImGuiWindow *)0x0;
    local_138.FutureNode.VisibleWindow = (ImGuiWindow *)0x0;
    local_138.FutureNode.CentralNode = (ImGuiDockNode *)0x0;
    local_138.FutureNode.OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
    local_138.FutureNode.LastFrameAlive = -1;
    local_138.FutureNode.LastFrameActive = -1;
    local_138.FutureNode.LastFrameFocused = -1;
    local_138.FutureNode.LastFocusedNodeID = 0;
    local_138.FutureNode.SelectedTabID = 0;
    local_138.FutureNode.WantCloseTabID = 0;
    local_138.FutureNode._176_2_ = 0x209;
    local_138.FutureNode._178_1_ = local_138.FutureNode._178_1_ & 0xf0;
    local_138.DropRectsDraw[0].Min.x = 0.0;
    local_138.DropRectsDraw[0].Min.y = 0.0;
    local_138.DropRectsDraw[0].Max.x = 0.0;
    local_138.DropRectsDraw[0].Max.y = 0.0;
    local_138.DropRectsDraw[1].Min.x = 0.0;
    local_138.DropRectsDraw[1].Min.y = 0.0;
    local_138.DropRectsDraw[1].Max.x = 0.0;
    local_138.DropRectsDraw[1].Max.y = 0.0;
    local_138.DropRectsDraw[2].Min.x = 0.0;
    local_138.DropRectsDraw[2].Min.y = 0.0;
    local_138.DropRectsDraw[2].Max.x = 0.0;
    local_138.DropRectsDraw[2].Max.y = 0.0;
    local_138.DropRectsDraw[3].Min.x = 0.0;
    local_138.DropRectsDraw[3].Min.y = 0.0;
    local_138.DropRectsDraw[3].Max.x = 0.0;
    local_138.DropRectsDraw[3].Max.y = 0.0;
    local_138.DropRectsDraw[4].Min.x = 0.0;
    local_138.DropRectsDraw[4].Min.y = 0.0;
    local_138.DropRectsDraw[4].Max.x = 0.0;
    local_138.DropRectsDraw[4].Max.y = 0.0;
    local_138.SplitNode = (ImGuiDockNode *)0x0;
    local_138.IsDropAllowed = false;
    local_138.IsCenterAvailable = false;
    local_138.IsSidesAvailable = false;
    local_138.IsSplitDirExplicit = false;
    local_138.SplitDir = -1;
    local_138.SplitRatio = 0.0;
    DockNodePreviewDockSetup(target,target_node,payload,&local_138,false,false);
    IVar1 = local_138.DropRectsDraw[(long)split_dir + 1].Min;
    fVar3 = IVar1.x;
    fVar4 = IVar1.y;
    IVar1 = local_138.DropRectsDraw[(long)split_dir + 1].Max;
    fVar5 = IVar1.x;
    fVar6 = IVar1.y;
    bVar2 = (bool)(-(fVar4 <= fVar6) & fVar3 <= fVar5);
    if (bVar2 == true) {
      IVar1.y = (fVar4 + fVar6) * 0.5;
      IVar1.x = (fVar3 + fVar5) * 0.5;
      *out_pos = IVar1;
    }
    ImGuiDockNode::~ImGuiDockNode(&local_138.FutureNode);
  }
  return bVar2;
}

Assistant:

bool ImGui::DockContextCalcDropPosForDocking(ImGuiWindow* target, ImGuiDockNode* target_node, ImGuiWindow* payload, ImGuiDir split_dir, bool split_outer, ImVec2* out_pos)
{
    if (split_outer)
    {
        IM_ASSERT(0);
    }
    else
    {
        ImGuiDockPreviewData split_data;
        DockNodePreviewDockSetup(target, target_node, payload, &split_data, false, split_outer);
        if (split_data.DropRectsDraw[split_dir+1].IsInverted())
            return false;
        *out_pos = split_data.DropRectsDraw[split_dir+1].GetCenter();
        return true;
    }
    return false;
}